

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_mgr.cxx
# Opt level: O0

void __thiscall nuraft::stat_mgr::reset_stat(stat_mgr *this,string *stat_name)

{
  bool bVar1;
  iterator this_00;
  stat_elem *in_RSI;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nuraft::stat_elem_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nuraft::stat_elem_*>_>_>
  *in_RDI;
  stat_elem *elem;
  iterator entry;
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> *in_stack_ffffffffffffffb0;
  _Self local_40 [3];
  _Self local_28 [3];
  
  std::unique_lock<std::mutex>::unique_lock(in_stack_ffffffffffffffb0,(mutex_type *)in_RDI);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nuraft::stat_elem_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nuraft::stat_elem_*>_>_>
            ::find(in_RDI,(key_type *)0x237ee3);
  local_28[0]._M_node = this_00._M_node;
  local_40[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nuraft::stat_elem_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nuraft::stat_elem_*>_>_>
       ::end(in_RDI);
  bVar1 = std::operator!=(local_28,local_40);
  if (bVar1) {
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nuraft::stat_elem_*>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nuraft::stat_elem_*>_>
                  *)0x237f25);
    stat_elem::reset(in_RSI);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)this_00._M_node);
  return;
}

Assistant:

void stat_mgr::reset_stat(const std::string& stat_name) {
    std::unique_lock<std::mutex> l(stat_map_lock_);
    auto entry = stat_map_.find(stat_name);
    if (entry != stat_map_.end()) {
        stat_elem* elem = entry->second;
        elem->reset();
    }
}